

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBar::clear(ToolBar *this)

{
  long lVar1;
  QList<QAction_*> actions;
  QArrayData *local_28;
  long local_18;
  
  QWidget::actions();
  if (0 < local_18) {
    lVar1 = 0;
    do {
      QWidget::removeAction((QAction *)this);
      lVar1 = lVar1 + 1;
    } while (lVar1 < local_18);
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,8,8);
    }
  }
  return;
}

Assistant:

void
ToolBar::clear()
{
	QList< QAction* > actions = this->actions();

	for( int i = 0; i < actions.size(); ++i )
		removeAction( actions.at( i ) );
}